

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::AnsiPortListSyntax::AnsiPortListSyntax
          (AnsiPortListSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::MemberSyntax> *ports,Token closeParen)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  MemberSyntax *pMVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  size_t index;
  
  uVar5 = openParen._0_8_;
  uVar6 = closeParen._0_8_;
  (this->super_PortListSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_PortListSyntax).super_SyntaxNode.kind = AnsiPortList;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  SVar2 = (ports->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(ports->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.parent =
       (ports->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->ports).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->ports).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->ports).super_SyntaxListBase.childCount = (ports->super_SyntaxListBase).childCount;
  (this->ports).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004eccb0;
  sVar1 = (ports->elements).size_;
  (this->ports).elements.data_ = (ports->elements).data_;
  (this->ports).elements.size_ = sVar1;
  (this->closeParen).kind = (short)uVar6;
  (this->closeParen).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeParen).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeParen).info = closeParen.info;
  (this->ports).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->ports).elements.size_ + 1;
  if (1 < uVar7) {
    index = 0;
    do {
      pMVar4 = SeparatedSyntaxList<slang::syntax::MemberSyntax>::operator[](&this->ports,index);
      (pMVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
      index = index + 1;
    } while (uVar7 >> 1 != index);
  }
  return;
}

Assistant:

struct SLANG_EXPORT NamedLabelSyntax : public SyntaxNode {
    Token name;
    Token colon;

    NamedLabelSyntax(Token name, Token colon) :
        SyntaxNode(SyntaxKind::NamedLabel), name(name), colon(colon) {
    }

    explicit NamedLabelSyntax(const NamedLabelSyntax&) = default;

    static bool isKind(SyntaxKind kind);

    TokenOrSyntax getChild(size_t index);
    ConstTokenOrSyntax getChild(size_t index) const;
    void setChild(size_t index, TokenOrSyntax child);

}